

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O3

RadialGradientShape __thiscall
Rml::DecoratorRadialGradient::CalculateRadialGradientShape
          (DecoratorRadialGradient *this,Element *element,Vector2f dimensions)

{
  Shape SVar1;
  Vector2f a;
  Vector2f a_00;
  Vector2f a_01;
  Vector2f a_02;
  Vector2f a_03;
  Vector2f VVar2;
  Vector2f b;
  Vector2f b_00;
  Vector2f b_01;
  Vector2f b_02;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  RadialGradientShape RVar7;
  float fStack_54;
  float fStack_44;
  
  fVar4 = dimensions.x;
  fVar6 = dimensions.y;
  RVar7.center.x = Element::ResolveNumericValue(element,(this->position).x,fVar4);
  fVar3 = Element::ResolveNumericValue(element,(this->position).y,fVar6);
  if (LengthPercentage < this->size_type) {
    fVar4 = 0.0;
    fVar6 = 0.0;
    goto LAB_002097c0;
  }
  SVar1 = this->shape;
  switch(this->size_type) {
  case ClosestSide:
    a_02.y = fVar3;
    a_02.x = RVar7.center.x;
    b_02.y = fVar6 - fVar3;
    b_02.x = fVar4 - RVar7.center.x;
    VVar2 = Math::Min<Rml::Vector2<float>>(a_02,b_02);
    fVar4 = Math::Absolute(VVar2.x);
    fStack_44 = VVar2.y;
    fVar5 = Math::Absolute(fStack_44);
    fVar6 = fVar5;
    if ((SVar1 == Circle) && (fVar6 = fVar4, fVar5 <= fVar4)) {
      fVar4 = fVar5;
      fVar6 = fVar5;
    }
    break;
  case FarthestSide:
    a_01.y = fVar3;
    a_01.x = RVar7.center.x;
    b_01.y = fVar6 - fVar3;
    b_01.x = fVar4 - RVar7.center.x;
    VVar2 = Math::Max<Rml::Vector2<float>>(a_01,b_01);
    fVar4 = Math::Absolute(VVar2.x);
    fStack_44 = VVar2.y;
    fVar5 = Math::Absolute(fStack_44);
    fVar6 = fVar5;
    if ((SVar1 == Circle) && (fVar6 = fVar4, fVar4 <= fVar5)) {
      fVar4 = fVar5;
      fVar6 = fVar5;
    }
    break;
  case ClosestCorner:
    a.y = fVar3;
    a.x = RVar7.center.x;
    b_00.y = fVar6 - fVar3;
    b_00.x = fVar4 - RVar7.center.x;
    VVar2 = Math::Min<Rml::Vector2<float>>(a,b_00);
    fVar4 = VVar2.x;
    fVar6 = VVar2.y;
    goto LAB_002096ed;
  case FarthestCorner:
    VVar2.y = fVar3;
    VVar2.x = RVar7.center.x;
    b.y = fVar6 - fVar3;
    b.x = fVar4 - RVar7.center.x;
    VVar2 = Math::Max<Rml::Vector2<float>>(VVar2,b);
    fVar4 = VVar2.x;
    fVar6 = VVar2.y;
LAB_002096ed:
    fVar4 = Math::Absolute(fVar4);
    fVar6 = Math::Absolute(fVar6);
    if (SVar1 == Circle) {
      fVar4 = Math::SquareRoot(fVar4 * fVar4 + fVar6 * fVar6);
      fVar6 = fVar4;
    }
    else {
      a_00.y = fVar6;
      a_00.x = fVar4;
      VVar2 = Math::Max<Rml::Vector2<float>>(a_00,(Vector2f)0x3f8000003f800000);
      fVar6 = VVar2.x;
      fVar4 = Math::SquareRoot((fVar6 + fVar6) * fVar6);
      fStack_54 = VVar2.y;
      fVar6 = (fStack_54 / fVar6) * fVar4;
    }
    break;
  case LengthPercentage:
    fVar4 = Element::ResolveNumericValue(element,(this->size).x,fVar4);
    fVar5 = fVar4;
    if (SVar1 != Circle) {
      fVar5 = Element::ResolveNumericValue(element,(this->size).y,fVar6);
    }
    fVar4 = Math::Absolute(fVar4);
    fVar6 = Math::Absolute(fVar5);
  }
LAB_002097c0:
  a_03.y = fVar6;
  a_03.x = fVar4;
  VVar2 = Math::Max<Rml::Vector2<float>>(a_03,(Vector2f)0x3f8000003f800000);
  RVar7.center.y = fVar3;
  RVar7.radius = VVar2;
  return RVar7;
}

Assistant:

DecoratorRadialGradient::RadialGradientShape DecoratorRadialGradient::CalculateRadialGradientShape(Element* element, Vector2f dimensions) const
{
	RadialGradientShape result;
	result.center.x = element->ResolveNumericValue(position.x, dimensions.x);
	result.center.y = element->ResolveNumericValue(position.y, dimensions.y);
	const bool is_circle = (shape == Shape::Circle);

	auto Abs = [](Vector2f v) { return Vector2f{Math::Absolute(v.x), Math::Absolute(v.y)}; };
	auto d = dimensions;
	auto c = result.center;
	Vector2f r;

	switch (size_type)
	{
	case SizeType::ClosestSide:
	{
		r = Abs(Math::Min(c, d - c));
		result.radius = (is_circle ? Vector2f(Math::Min(r.x, r.y)) : r);
	}
	break;
	case SizeType::FarthestSide:
	{
		r = Abs(Math::Max(c, d - c));
		result.radius = (is_circle ? Vector2f(Math::Max(r.x, r.y)) : r);
	}
	break;
	case SizeType::ClosestCorner:
	case SizeType::FarthestCorner:
	{
		if (size_type == SizeType::ClosestCorner)
			r = Abs(Math::Min(c, d - c)); // Same as closest-side.
		else
			r = Abs(Math::Max(c, d - c)); // Same as farthest-side.

		if (is_circle)
		{
			result.radius = Vector2f(r.Magnitude());
		}
		else
		{
			r = Math::Max(r, Vector2f(1)); // In case r.x ~= 0
			result.radius.x = Math::SquareRoot(2.f * r.x * r.x);
			result.radius.y = result.radius.x * (r.y / r.x);
		}
	}
	break;
	case SizeType::LengthPercentage:
	{
		result.radius.x = element->ResolveNumericValue(size.x, d.x);
		result.radius.y = (is_circle ? result.radius.x : element->ResolveNumericValue(size.y, d.y));
		result.radius = Abs(result.radius);
	}
	break;
	}

	result.radius = Math::Max(result.radius, Vector2f(1.f));
	return result;
}